

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G2.c
# Opt level: O2

int G2_is_on_curve(G2 *op,ATE_CTX *ctx)

{
  int iVar1;
  fp2_t ty;
  fp2_t tx;
  fp2_t b;
  G2 tmp;
  fp2_struct_st fStack_1a8;
  fp2_struct_st local_168;
  fp2_struct_st local_128;
  G2 local_e8;
  
  G2_set(&local_e8,op);
  G2_makeaffine(&local_e8,ctx);
  fp2_setzero(&local_128);
  fp_set(local_128.m_a,ctx->b);
  fp2_square(&fStack_1a8,local_e8.m_y,ctx);
  fp2_square(&local_168,local_e8.m_x,ctx);
  fp2_mul(&local_168,&local_168,local_e8.m_x,ctx);
  fp2_add(&local_168,&local_168,&local_128,ctx->p);
  iVar1 = fp2_cmp(&local_168,&fStack_1a8);
  return (int)(iVar1 == 0);
}

Assistant:

int G2_is_on_curve(const G2 *op, const ATE_CTX *ctx)
{
    fp2_t b;
    fp2_t tx, ty;
    G2 tmp;
    G2_set(&tmp, op);
    G2_makeaffine(&tmp, ctx);
    fp2_setzero(b);
    fp_set(b->m_a, ctx->b); /* b*sqrt(-2) */

    fp2_square(ty, tmp.m_y, ctx); /* y^2 */
    fp2_square(tx, tmp.m_x, ctx);
    fp2_mul(tx, tx, tmp.m_x, ctx); /* x^3 */
    fp2_add(tx, tx, b, ctx->p); /* x^3 + b*sqrt(-2) */
    
    return fp2_cmp(tx, ty) == 0;
}